

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listbox_widget.cpp
# Opt level: O0

int listbox_width_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Object local_18;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)self);
  this = Am_Object::Get(&local_18,0x66,0);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&local_18);
  return iVar1 + -10;
}

Assistant:

Am_Define_Formula(int, listbox_width)
{
  // Get the object owning the listbox
  Am_Object owner = self.Get_Owner();

  // return a width, which is a bit smaller than the parent width
  // TODO: Add a WIDTH_SUBTRACTOR slot to the object
  return (static_cast<int>(owner.Get(Am_WIDTH)) -
          10 /* GUIConstant::listboxWidthSubtractor */);
}